

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gls::LocationMaxAttributesTest::iterate(LocationMaxAttributesTest *this)

{
  deInt32 dVar1;
  long *plVar2;
  int iVar3;
  size_type *psVar4;
  int layoutLocation;
  int iVar5;
  string local_2b8;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  attributes;
  long *local_278 [2];
  long local_268 [2];
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  noBindings;
  Attribute local_238;
  undefined1 local_1b8 [8];
  _Alloc_hider _Stack_1b0;
  pointer local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [5];
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar1 = anon_unknown_1::getMaxAttributeLocations(this->m_renderCtx);
  iVar3 = 1;
  if (this->m_arraySize != -1) {
    iVar3 = this->m_arraySize;
  }
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&_Stack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&_Stack_1b0,"GL_MAX_VERTEX_ATTRIBS: ",0x17);
  std::ostream::operator<<((ostringstream *)&_Stack_1b0,dVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&_Stack_1b0);
  std::ios_base::~ios_base(local_140);
  layoutLocation = dVar1 - (this->m_type).m_locationSize * iVar3;
  if (-1 < layoutLocation) {
    iVar5 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::ostream::operator<<((Cond *)local_1b8,iVar5);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
      std::ios_base::~ios_base(local_148);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_278,0,(char *)0x0,0xb85d7f);
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_2b8.field_2._M_allocated_capacity = *psVar4;
        local_2b8.field_2._8_8_ = plVar2[3];
      }
      else {
        local_2b8.field_2._M_allocated_capacity = *psVar4;
        local_2b8._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_2b8._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      local_1b8[0] = 1;
      local_1a0[0]._M_allocated_capacity = 0x737961776c615f5f;
      local_1a0[0]._8_2_ = 0x5f5f;
      local_1a8 = (pointer)0xa;
      local_1a0[0]._M_local_buf[10] = '\0';
      _Stack_1b0._M_p = (pointer)local_1a0;
      AttributeLocationTestUtil::Attribute::Attribute
                (&local_238,&this->m_type,&local_2b8,layoutLocation,(Cond *)local_1b8,
                 this->m_arraySize);
      std::
      vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
      ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.m_cond.m_name._M_dataplus._M_p != &local_238.m_cond.m_name.field_2) {
        operator_delete(local_238.m_cond.m_name._M_dataplus._M_p,
                        local_238.m_cond.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.m_name._M_dataplus._M_p != &local_238.m_name.field_2) {
        operator_delete(local_238.m_name._M_dataplus._M_p,
                        local_238.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.m_type.m_name._M_dataplus._M_p != &local_238.m_type.m_name.field_2) {
        operator_delete(local_238.m_type.m_name._M_dataplus._M_p,
                        local_238.m_type.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_1b0._M_p != local_1a0) {
        operator_delete(_Stack_1b0._M_p,local_1a0[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if (local_278[0] != local_268) {
        operator_delete(local_278[0],local_268[0] + 1);
      }
      iVar5 = iVar5 + 1;
      layoutLocation = layoutLocation - (this->m_type).m_locationSize * iVar3;
    } while (-1 < layoutLocation);
  }
  local_1b8 = (undefined1  [8])0x0;
  _Stack_1b0._M_p = (pointer)0x0;
  local_1a8 = (pointer)0x0;
  AttributeLocationTestUtil::runTest
            ((this->super_TestCase).super_TestNode.m_testCtx,this->m_renderCtx,&attributes,
             &noBindings,&noBindings,&noBindings,false,false,
             (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
              *)local_1b8);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             *)local_1b8);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&attributes);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&noBindings);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult LocationMaxAttributesTest::iterate (void)
{
	const vector<Bind>	noBindings;
	const deInt32		maxAttributes		= getMaxAttributeLocations(m_renderCtx);
	const int			arrayElementCount	= (m_arraySize != Attribute::NOT_ARRAY ? m_arraySize : 1);

	vector<Attribute>	attributes;
	int					ndx = 0;

	m_testCtx.getLog() << TestLog::Message << "GL_MAX_VERTEX_ATTRIBS: " << maxAttributes << TestLog::EndMessage;

	for (int loc = maxAttributes - (arrayElementCount * m_type.getLocationSize()); loc >= 0; loc -= (arrayElementCount * m_type.getLocationSize()))
	{
		attributes.push_back(Attribute(m_type, "a_" + de::toString(ndx), loc, Cond::COND_ALWAYS, m_arraySize));
		ndx++;
	}

	runTest(m_testCtx, m_renderCtx, attributes, noBindings, noBindings, noBindings, false);
	return STOP;
}